

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void constructor(LexState *ls,expdesc *t)

{
  int where;
  uint uVar1;
  FuncState *fs;
  Instruction *pIVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ConsControl cc;
  ConsControl local_60;
  
  fs = ls->fs;
  where = ls->linenumber;
  iVar3 = luaK_code(fs,10,fs->ls->lastline);
  local_60.tostore = 0;
  local_60.nh = 0;
  local_60.na = 0;
  t->t = -1;
  t->f = -1;
  t->k = VRELOCABLE;
  (t->u).s.info = iVar3;
  local_60.v.t = -1;
  local_60.v.f = -1;
  local_60.v.k = VVOID;
  local_60.v.u.s.info = 0;
  local_60.t = t;
  luaK_exp2nextreg(ls->fs,t);
  checknext(ls,0x7b);
  if ((ls->t).token != 0x7d) {
    do {
      if (local_60.v.k != VVOID) {
        luaK_exp2nextreg(fs,&local_60.v);
        local_60.v.k = VVOID;
        if (local_60.tostore == 0x32) {
          luaK_setlist(fs,((local_60.t)->u).s.info,local_60.na,0x32);
          local_60.tostore = 0;
        }
      }
      iVar4 = (ls->t).token;
      if (iVar4 == 0x5b) {
LAB_0010e072:
        recfield(ls,&local_60);
      }
      else {
        if (iVar4 == 0x11d) {
          iVar4 = llex(ls,&(ls->lookahead).seminfo);
          (ls->lookahead).token = iVar4;
          if (iVar4 == 0x3d) goto LAB_0010e072;
        }
        listfield(ls,&local_60);
      }
      iVar4 = testnext(ls,0x2c);
    } while (((iVar4 != 0) || (iVar4 = testnext(ls,0x3b), iVar4 != 0)) && ((ls->t).token != 0x7d));
  }
  check_match(ls,0x7d,0x7b,where);
  if (local_60.tostore != 0) {
    if (local_60.v.k - VCALL < 2) {
      luaK_setreturns(fs,&local_60.v,-1);
      luaK_setlist(fs,((local_60.t)->u).s.info,local_60.na,-1);
      local_60.na = local_60.na - 1;
    }
    else {
      if (local_60.v.k != VVOID) {
        luaK_exp2nextreg(fs,&local_60.v);
      }
      luaK_setlist(fs,((local_60.t)->u).s.info,local_60.na,local_60.tostore);
    }
  }
  pIVar2 = fs->f->code;
  uVar1 = pIVar2[iVar3];
  uVar5 = 8;
  if ((uint)local_60.na < 0x10) {
    uVar7 = 8;
  }
  else {
    uVar7 = 8;
    do {
      uVar6 = local_60.na + 1;
      local_60.na = uVar6 >> 1;
      uVar7 = uVar7 + 8;
    } while (0x1f < uVar6);
  }
  uVar7 = local_60.na + 0x1f8U | uVar7;
  if ((uint)local_60.na < 8) {
    uVar7 = local_60.na;
  }
  pIVar2[iVar3] = uVar7 << 0x17 | uVar1 & 0x7fffff;
  if (0xf < (uint)local_60.nh) {
    uVar5 = 8;
    do {
      uVar6 = local_60.nh + 1;
      local_60.nh = uVar6 >> 1;
      uVar5 = uVar5 + 8;
    } while (0x1f < uVar6);
  }
  uVar5 = local_60.nh + 0x1f8U | uVar5;
  if ((uint)local_60.nh < 8) {
    uVar5 = local_60.nh;
  }
  pIVar2[iVar3] = (uVar5 & 0x1ff) << 0xe | uVar7 << 0x17 | uVar1 & 0x3fff;
  return;
}

Assistant:

static void constructor(LexState*ls,expdesc*t){
FuncState*fs=ls->fs;
int line=ls->linenumber;
int pc=luaK_codeABC(fs,OP_NEWTABLE,0,0,0);
struct ConsControl cc;
cc.na=cc.nh=cc.tostore=0;
cc.t=t;
init_exp(t,VRELOCABLE,pc);
init_exp(&cc.v,VVOID,0);
luaK_exp2nextreg(ls->fs,t);
checknext(ls,'{');
do{
if(ls->t.token=='}')break;
closelistfield(fs,&cc);
switch(ls->t.token){
case TK_NAME:{
luaX_lookahead(ls);
if(ls->lookahead.token!='=')
listfield(ls,&cc);
else
recfield(ls,&cc);
break;
}
case'[':{
recfield(ls,&cc);
break;
}
default:{
listfield(ls,&cc);
break;
}
}
}while(testnext(ls,',')||testnext(ls,';'));
check_match(ls,'}','{',line);
lastlistfield(fs,&cc);
SETARG_B(fs->f->code[pc],luaO_int2fb(cc.na));
SETARG_C(fs->f->code[pc],luaO_int2fb(cc.nh));
}